

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchcompute_test.cc
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BatchCompute *this;
  HttpTestListener *pHVar2;
  undefined8 extraout_RAX;
  BatchComputeDeleteImageResponseType resp;
  BatchComputeDeleteImageRequestType req;
  BatchComputeListImagesResponseType resp_8;
  BatchComputeErrorInfo local_f1;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined6 uStack_df;
  undefined4 uStack_d9;
  undefined1 local_d5;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  ushort local_b8;
  undefined7 *local_b0;
  undefined8 local_a8;
  undefined7 local_a0;
  undefined1 uStack_99;
  undefined1 uStack_98;
  undefined2 uStack_97;
  undefined1 local_95;
  string local_90;
  string local_70;
  string local_50;
  
  local_f0 = &local_e0;
  local_e8 = 0;
  local_e0 = 0;
  local_a0 = 0x6e6568732d6e63;
  uStack_99 = 0x7a;
  uStack_98 = 0x68;
  uStack_97 = 0x6e65;
  local_a8 = 0xb;
  local_95 = 0;
  local_c0 = 0x64697070615f796d;
  local_c8 = 8;
  local_b8 = local_b8 & 0xff00;
  paVar1 = &local_70.field_2;
  local_70.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
  local_70.field_2._M_local_buf[7] = 'e';
  local_70.field_2._M_local_buf[8] = 't';
  local_70._M_string_length = 9;
  local_70.field_2._M_local_buf[9] = '\0';
  local_d0 = &local_c0;
  local_b0 = &local_a0;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  this = (BatchCompute *)
         aliyun::BatchCompute::CreateBatchComputeClient(&local_b0,&local_d0,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT17(local_70.field_2._M_local_buf[7],
                             local_70.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
  }
  if (this == (BatchCompute *)0x0) {
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
    }
    local_f0 = &local_e0;
    local_e8 = 0;
    local_e0 = 0;
    local_a0 = 0x676e61682d6e63;
    uStack_99 = 0x7a;
    uStack_98 = 0x68;
    uStack_97 = 0x756f;
    local_a8 = 0xb;
    local_95 = 0;
    local_c0 = 0x64697070615f796d;
    local_c8 = 8;
    local_b8 = local_b8 & 0xff00;
    local_70.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_70.field_2._M_local_buf[7] = 'e';
    local_70.field_2._M_local_buf[8] = 't';
    local_70._M_string_length = 9;
    local_70.field_2._M_local_buf[9] = '\0';
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               local_70.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
    }
    if (this != (BatchCompute *)0x0) goto LAB_0010581e;
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
    }
    local_f0 = &local_e0;
    local_e8 = 0;
    local_e0 = 0;
    local_a0 = 0x676e61682d6e63;
    uStack_99 = 0x7a;
    uStack_98 = 0x68;
    uStack_97 = 0x756f;
    local_a8 = 0xb;
    local_95 = 0;
    local_c0 = 0x64697070615f796d;
    local_c8 = 8;
    local_b8 = local_b8 & 0xff00;
    local_70.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_70.field_2._M_local_buf[7] = 'e';
    local_70.field_2._M_local_buf[8] = 't';
    local_70._M_string_length = 9;
    local_70.field_2._M_local_buf[9] = '\0';
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               local_70.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
    }
    if (this != (BatchCompute *)0x0) goto LAB_00105921;
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
    }
    local_f0 = &local_e0;
    local_e8 = 0;
    local_e0 = 0;
    local_a0 = 0x676e61682d6e63;
    uStack_99 = 0x7a;
    uStack_98 = 0x68;
    uStack_97 = 0x756f;
    local_a8 = 0xb;
    local_95 = 0;
    local_c0 = 0x64697070615f796d;
    local_c8 = 8;
    local_b8 = local_b8 & 0xff00;
    local_70.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_70.field_2._M_local_buf[7] = 'e';
    local_70.field_2._M_local_buf[8] = 't';
    local_70._M_string_length = 9;
    local_70.field_2._M_local_buf[9] = '\0';
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               local_70.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
    }
    if (this != (BatchCompute *)0x0) goto LAB_00105a24;
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
    }
    local_f0 = &local_e0;
    local_e8 = 0;
    local_e0 = 0;
    local_a0 = 0x676e61682d6e63;
    uStack_99 = 0x7a;
    uStack_98 = 0x68;
    uStack_97 = 0x756f;
    local_a8 = 0xb;
    local_95 = 0;
    local_c0 = 0x64697070615f796d;
    local_c8 = 8;
    local_b8 = local_b8 & 0xff00;
    local_70.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_70.field_2._M_local_buf[7] = 'e';
    local_70.field_2._M_local_buf[8] = 't';
    local_70._M_string_length = 9;
    local_70.field_2._M_local_buf[9] = '\0';
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               local_70.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
    }
    if (this != (BatchCompute *)0x0) goto LAB_00105b27;
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
    }
    local_f0 = &local_e0;
    local_e8 = 0;
    local_e0 = 0;
    local_a0 = 0x676e61682d6e63;
    uStack_99 = 0x7a;
    uStack_98 = 0x68;
    uStack_97 = 0x756f;
    local_a8 = 0xb;
    local_95 = 0;
    local_c0 = 0x64697070615f796d;
    local_c8 = 8;
    local_b8 = local_b8 & 0xff00;
    local_70.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_70.field_2._M_local_buf[7] = 'e';
    local_70.field_2._M_local_buf[8] = 't';
    local_70._M_string_length = 9;
    local_70.field_2._M_local_buf[9] = '\0';
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               local_70.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
    }
    if (this != (BatchCompute *)0x0) goto LAB_00105c2a;
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
    }
    local_f0 = &local_e0;
    local_e8 = 0;
    local_e0 = 0;
    local_a0 = 0x676e61682d6e63;
    uStack_99 = 0x7a;
    uStack_98 = 0x68;
    uStack_97 = 0x756f;
    local_a8 = 0xb;
    local_95 = 0;
    local_c0 = 0x64697070615f796d;
    local_c8 = 8;
    local_b8 = local_b8 & 0xff00;
    local_70.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_70.field_2._M_local_buf[7] = 'e';
    local_70.field_2._M_local_buf[8] = 't';
    local_70._M_string_length = 9;
    local_70.field_2._M_local_buf[9] = '\0';
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               local_70.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
    }
    if (this != (BatchCompute *)0x0) goto LAB_00105d2d;
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
    }
    local_f0 = &local_e0;
    local_e8 = 0;
    local_e0 = 0;
    local_a0 = 0x676e61682d6e63;
    uStack_99 = 0x7a;
    uStack_98 = 0x68;
    uStack_97 = 0x756f;
    local_a8 = 0xb;
    local_95 = 0;
    local_c0 = 0x64697070615f796d;
    local_c8 = 8;
    local_b8 = local_b8 & 0xff00;
    local_70.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_70.field_2._M_local_buf[7] = 'e';
    local_70.field_2._M_local_buf[8] = 't';
    local_70._M_string_length = 9;
    local_70.field_2._M_local_buf[9] = '\0';
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               local_70.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
    }
    if (this != (BatchCompute *)0x0) goto LAB_00105e30;
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
    }
    local_f0 = &local_e0;
    local_e0 = 99;
    uStack_df = 0x676e61682d6e;
    uStack_d9 = 0x756f687a;
    local_e8 = 0xb;
    local_d5 = 0;
    local_a0 = 0x697070615f796d;
    uStack_99 = 100;
    local_a8 = 8;
    uStack_98 = 0;
    local_c0 = 0x65726365735f796d;
    local_b8 = 0x74;
    local_c8 = 9;
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
    }
    if (this != (BatchCompute *)0x0) goto LAB_00105f33;
    local_f0 = &local_e0;
    local_e0 = 99;
    uStack_df = 0x676e61682d6e;
    uStack_d9 = 0x756f687a;
    local_e8 = 0xb;
    local_d5 = 0;
    local_a0 = 0x697070615f796d;
    uStack_99 = 100;
    local_a8 = 8;
    uStack_98 = 0;
    local_c0 = 0x65726365735f796d;
    local_b8 = 0x74;
    local_c8 = 9;
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
    }
    if (this != (BatchCompute *)0x0) goto LAB_00105ff5;
    local_f0 = &local_e0;
    local_e0 = 99;
    uStack_df = 0x676e61682d6e;
    uStack_d9 = 0x756f687a;
    local_e8 = 0xb;
    local_d5 = 0;
    local_a0 = 0x697070615f796d;
    uStack_99 = 100;
    local_a8 = 8;
    uStack_98 = 0;
    local_c0 = 0x65726365735f796d;
    local_b8 = 0x74;
    local_c8 = 9;
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
    }
    if (this != (BatchCompute *)0x0) goto LAB_001060b7;
    local_f0 = &local_e0;
    local_e0 = 99;
    uStack_df = 0x676e61682d6e;
    uStack_d9 = 0x756f687a;
    local_e8 = 0xb;
    local_d5 = 0;
    local_a0 = 0x697070615f796d;
    uStack_99 = 100;
    local_a8 = 8;
    uStack_98 = 0;
    local_c0 = 0x65726365735f796d;
    local_b8 = 0x74;
    local_c8 = 9;
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
    }
    if (this != (BatchCompute *)0x0) goto LAB_00106179;
    local_f0 = &local_e0;
    local_e8 = 0;
    local_e0 = 0;
    local_a0 = 0x676e61682d6e63;
    uStack_99 = 0x7a;
    uStack_98 = 0x68;
    uStack_97 = 0x756f;
    local_a8 = 0xb;
    local_95 = 0;
    local_c0 = 0x64697070615f796d;
    local_c8 = 8;
    local_b8 = local_b8 & 0xff00;
    local_70.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_70.field_2._M_local_buf[7] = 'e';
    local_70.field_2._M_local_buf[8] = 't';
    local_70._M_string_length = 9;
    local_70.field_2._M_local_buf[9] = '\0';
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               local_70.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
    }
    if (this != (BatchCompute *)0x0) goto LAB_0010623b;
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
    }
    local_f0 = &local_e0;
    local_e8 = 0;
    local_e0 = 0;
    local_a0 = 0x676e61682d6e63;
    uStack_99 = 0x7a;
    uStack_98 = 0x68;
    uStack_97 = 0x756f;
    local_a8 = 0xb;
    local_95 = 0;
    local_c0 = 0x64697070615f796d;
    local_c8 = 8;
    local_b8 = local_b8 & 0xff00;
    local_70.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_70.field_2._M_local_buf[7] = 'e';
    local_70.field_2._M_local_buf[8] = 't';
    local_70._M_string_length = 9;
    local_70.field_2._M_local_buf[9] = '\0';
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               local_70.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
    }
    if (this != (BatchCompute *)0x0) goto LAB_0010633e;
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
    }
    local_f0 = &local_e0;
    local_e8 = 0;
    local_e0 = 0;
    local_a0 = 0x676e61682d6e63;
    uStack_99 = 0x7a;
    uStack_98 = 0x68;
    uStack_97 = 0x756f;
    local_a8 = 0xb;
    local_95 = 0;
    local_c0 = 0x64697070615f796d;
    local_c8 = 8;
    local_b8 = local_b8 & 0xff00;
    local_70.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_70.field_2._M_local_buf[7] = 'e';
    local_70.field_2._M_local_buf[8] = 't';
    local_70._M_string_length = 9;
    local_70.field_2._M_local_buf[9] = '\0';
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               local_70.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
    }
    if (this == (BatchCompute *)0x0) {
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
      }
      local_f0 = &local_e0;
      local_e8 = 0;
      local_e0 = 0;
      local_a0 = 0x676e61682d6e63;
      uStack_99 = 0x7a;
      uStack_98 = 0x68;
      uStack_97 = 0x756f;
      local_a8 = 0xb;
      local_95 = 0;
      local_c0 = 0x64697070615f796d;
      local_c8 = 8;
      local_b8 = local_b8 & 0xff00;
      local_70.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
      local_70.field_2._M_local_buf[7] = 'e';
      local_70.field_2._M_local_buf[8] = 't';
      local_70._M_string_length = 9;
      local_70.field_2._M_local_buf[9] = '\0';
      local_d0 = &local_c0;
      local_b0 = &local_a0;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      this = (BatchCompute *)aliyun::BatchCompute::CreateBatchComputeClient();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT17(local_70.field_2._M_local_buf[7],
                                 local_70.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,CONCAT17(uStack_99,local_a0) + 1);
      }
      if (this == (BatchCompute *)0x0) {
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1)
          ;
        }
        return 0;
      }
      goto LAB_00106544;
    }
  }
  else {
    local_50.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_50.field_2._M_local_buf[2] = '7';
    local_50.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_50.field_2._M_local_buf[7] = '.';
    local_50.field_2._8_7_ = 0x34333232313a31;
    local_50._M_string_length = 0xf;
    local_50.field_2._M_local_buf[0xf] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    aliyun::BatchCompute::SetProxyHost(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT17(local_50.field_2._M_local_buf[7],
                               CONCAT43(local_50.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_50.field_2._M_local_buf[2],
                                                 local_50.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    if (this[0x28] == (BatchCompute)0x1) {
      this[0x29] = (BatchCompute)0x0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_90.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_90._M_string_length = 2;
    local_90.field_2._M_local_buf[2] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_90.field_2._M_local_buf[2],
                                        local_90.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceName");
    aliyun::BatchCompute::DeleteImage
              ((BatchComputeDeleteImageRequestType *)this,
               (BatchComputeDeleteImageResponseType *)&local_f0,&local_f1);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_1();
LAB_0010581e:
    local_50.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_50.field_2._M_local_buf[2] = '7';
    local_50.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_50.field_2._M_local_buf[7] = '.';
    local_50.field_2._8_7_ = 0x34333232313a31;
    local_50._M_string_length = 0xf;
    local_50.field_2._M_local_buf[0xf] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    aliyun::BatchCompute::SetProxyHost(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT17(local_50.field_2._M_local_buf[7],
                               CONCAT43(local_50.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_50.field_2._M_local_buf[2],
                                                 local_50.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    if (this[0x28] == (BatchCompute)0x1) {
      this[0x29] = (BatchCompute)0x0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_90.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_90._M_string_length = 2;
    local_90.field_2._M_local_buf[2] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_90.field_2._M_local_buf[2],
                                        local_90.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceName");
    aliyun::BatchCompute::DeleteJob
              ((BatchComputeDeleteJobRequestType *)this,
               (BatchComputeDeleteJobResponseType *)&local_f0,&local_f1);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_2();
LAB_00105921:
    local_50.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_50.field_2._M_local_buf[2] = '7';
    local_50.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_50.field_2._M_local_buf[7] = '.';
    local_50.field_2._8_7_ = 0x34333232313a31;
    local_50._M_string_length = 0xf;
    local_50.field_2._M_local_buf[0xf] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    aliyun::BatchCompute::SetProxyHost(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT17(local_50.field_2._M_local_buf[7],
                               CONCAT43(local_50.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_50.field_2._M_local_buf[2],
                                                 local_50.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    if (this[0x28] == (BatchCompute)0x1) {
      this[0x29] = (BatchCompute)0x0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_90.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_90._M_string_length = 2;
    local_90.field_2._M_local_buf[2] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_90.field_2._M_local_buf[2],
                                        local_90.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceName");
    aliyun::BatchCompute::DeleteSnapshot
              ((BatchComputeDeleteSnapshotRequestType *)this,
               (BatchComputeDeleteSnapshotResponseType *)&local_f0,&local_f1);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_3();
LAB_00105a24:
    local_50.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_50.field_2._M_local_buf[2] = '7';
    local_50.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_50.field_2._M_local_buf[7] = '.';
    local_50.field_2._8_7_ = 0x34333232313a31;
    local_50._M_string_length = 0xf;
    local_50.field_2._M_local_buf[0xf] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    aliyun::BatchCompute::SetProxyHost(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT17(local_50.field_2._M_local_buf[7],
                               CONCAT43(local_50.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_50.field_2._M_local_buf[2],
                                                 local_50.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    if (this[0x28] == (BatchCompute)0x1) {
      this[0x29] = (BatchCompute)0x0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_90.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_90._M_string_length = 2;
    local_90.field_2._M_local_buf[2] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_90.field_2._M_local_buf[2],
                                        local_90.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceName");
    aliyun::BatchCompute::GetImage
              ((BatchComputeGetImageRequestType *)this,(BatchComputeGetImageResponseType *)&local_f0
               ,&local_f1);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_4();
LAB_00105b27:
    local_50.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_50.field_2._M_local_buf[2] = '7';
    local_50.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_50.field_2._M_local_buf[7] = '.';
    local_50.field_2._8_7_ = 0x34333232313a31;
    local_50._M_string_length = 0xf;
    local_50.field_2._M_local_buf[0xf] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    aliyun::BatchCompute::SetProxyHost(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT17(local_50.field_2._M_local_buf[7],
                               CONCAT43(local_50.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_50.field_2._M_local_buf[2],
                                                 local_50.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    if (this[0x28] == (BatchCompute)0x1) {
      this[0x29] = (BatchCompute)0x0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_90.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_90._M_string_length = 2;
    local_90.field_2._M_local_buf[2] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_90.field_2._M_local_buf[2],
                                        local_90.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceName");
    aliyun::BatchCompute::GetJob
              ((BatchComputeGetJobRequestType *)this,(BatchComputeGetJobResponseType *)&local_f0,
               &local_f1);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_5();
LAB_00105c2a:
    local_50.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_50.field_2._M_local_buf[2] = '7';
    local_50.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_50.field_2._M_local_buf[7] = '.';
    local_50.field_2._8_7_ = 0x34333232313a31;
    local_50._M_string_length = 0xf;
    local_50.field_2._M_local_buf[0xf] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    aliyun::BatchCompute::SetProxyHost(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT17(local_50.field_2._M_local_buf[7],
                               CONCAT43(local_50.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_50.field_2._M_local_buf[2],
                                                 local_50.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    if (this[0x28] == (BatchCompute)0x1) {
      this[0x29] = (BatchCompute)0x0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_90.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_90._M_string_length = 2;
    local_90.field_2._M_local_buf[2] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_90.field_2._M_local_buf[2],
                                        local_90.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceName");
    aliyun::BatchCompute::GetJobDescription
              ((BatchComputeGetJobDescriptionRequestType *)this,
               (BatchComputeGetJobDescriptionResponseType *)&local_f0,&local_f1);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_6();
LAB_00105d2d:
    local_50.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_50.field_2._M_local_buf[2] = '7';
    local_50.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_50.field_2._M_local_buf[7] = '.';
    local_50.field_2._8_7_ = 0x34333232313a31;
    local_50._M_string_length = 0xf;
    local_50.field_2._M_local_buf[0xf] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    aliyun::BatchCompute::SetProxyHost(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT17(local_50.field_2._M_local_buf[7],
                               CONCAT43(local_50.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_50.field_2._M_local_buf[2],
                                                 local_50.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    if (this[0x28] == (BatchCompute)0x1) {
      this[0x29] = (BatchCompute)0x0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_90.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_90._M_string_length = 2;
    local_90.field_2._M_local_buf[2] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_90.field_2._M_local_buf[2],
                                        local_90.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceName");
    aliyun::BatchCompute::GetSnapshot
              ((BatchComputeGetSnapshotRequestType *)this,
               (BatchComputeGetSnapshotResponseType *)&local_f0,&local_f1);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_7();
LAB_00105e30:
    local_50.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_50.field_2._M_local_buf[2] = '7';
    local_50.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_50.field_2._M_local_buf[7] = '.';
    local_50.field_2._8_7_ = 0x34333232313a31;
    local_50._M_string_length = 0xf;
    local_50.field_2._M_local_buf[0xf] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    aliyun::BatchCompute::SetProxyHost(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT17(local_50.field_2._M_local_buf[7],
                               CONCAT43(local_50.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_50.field_2._M_local_buf[2],
                                                 local_50.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    if (this[0x28] == (BatchCompute)0x1) {
      this[0x29] = (BatchCompute)0x0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_90.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_90._M_string_length = 2;
    local_90.field_2._M_local_buf[2] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_90.field_2._M_local_buf[2],
                                        local_90.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceName");
    aliyun::BatchCompute::GetTasks
              ((BatchComputeGetTasksRequestType *)this,(BatchComputeGetTasksResponseType *)&local_f0
               ,&local_f1);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_8();
LAB_00105f33:
    local_70.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_70.field_2._M_local_buf[7] = '.';
    local_70.field_2._M_local_buf[8] = '1';
    local_70.field_2._M_local_buf[9] = ':';
    local_70.field_2._10_5_ = 0x3433323231;
    local_70._M_string_length = 0xf;
    local_70.field_2._M_local_buf[0xf] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar1;
    aliyun::BatchCompute::SetProxyHost(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               local_70.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (this[0x28] == (BatchCompute)0x1) {
      this[0x29] = (BatchCompute)0x0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_50._M_string_length = 2;
    local_50.field_2._M_local_buf[2] = '\0';
    HttpTestListener::SetResponseBody(pHVar2,&local_50);
    main_cold_9();
LAB_00105ff5:
    local_70.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_70.field_2._M_local_buf[7] = '.';
    local_70.field_2._M_local_buf[8] = '1';
    local_70.field_2._M_local_buf[9] = ':';
    local_70.field_2._10_5_ = 0x3433323231;
    local_70._M_string_length = 0xf;
    local_70.field_2._M_local_buf[0xf] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar1;
    aliyun::BatchCompute::SetProxyHost(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               local_70.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (this[0x28] == (BatchCompute)0x1) {
      this[0x29] = (BatchCompute)0x0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_50._M_string_length = 2;
    local_50.field_2._M_local_buf[2] = '\0';
    HttpTestListener::SetResponseBody(pHVar2,&local_50);
    main_cold_10();
LAB_001060b7:
    local_70.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_70.field_2._M_local_buf[7] = '.';
    local_70.field_2._M_local_buf[8] = '1';
    local_70.field_2._M_local_buf[9] = ':';
    local_70.field_2._10_5_ = 0x3433323231;
    local_70._M_string_length = 0xf;
    local_70.field_2._M_local_buf[0xf] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar1;
    aliyun::BatchCompute::SetProxyHost(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               local_70.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (this[0x28] == (BatchCompute)0x1) {
      this[0x29] = (BatchCompute)0x0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_50._M_string_length = 2;
    local_50.field_2._M_local_buf[2] = '\0';
    HttpTestListener::SetResponseBody(pHVar2,&local_50);
    main_cold_11();
LAB_00106179:
    local_70.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_70.field_2._M_local_buf[7] = '.';
    local_70.field_2._M_local_buf[8] = '1';
    local_70.field_2._M_local_buf[9] = ':';
    local_70.field_2._10_5_ = 0x3433323231;
    local_70._M_string_length = 0xf;
    local_70.field_2._M_local_buf[0xf] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar1;
    aliyun::BatchCompute::SetProxyHost(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT17(local_70.field_2._M_local_buf[7],
                               local_70.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (this[0x28] == (BatchCompute)0x1) {
      this[0x29] = (BatchCompute)0x0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_50._M_string_length = 2;
    local_50.field_2._M_local_buf[2] = '\0';
    HttpTestListener::SetResponseBody(pHVar2,&local_50);
    main_cold_12();
LAB_0010623b:
    local_50.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_50.field_2._M_local_buf[2] = '7';
    local_50.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_50.field_2._M_local_buf[7] = '.';
    local_50.field_2._8_7_ = 0x34333232313a31;
    local_50._M_string_length = 0xf;
    local_50.field_2._M_local_buf[0xf] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    aliyun::BatchCompute::SetProxyHost(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT17(local_50.field_2._M_local_buf[7],
                               CONCAT43(local_50.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_50.field_2._M_local_buf[2],
                                                 local_50.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    if (this[0x28] == (BatchCompute)0x1) {
      this[0x29] = (BatchCompute)0x0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_90.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_90._M_string_length = 2;
    local_90.field_2._M_local_buf[2] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_90.field_2._M_local_buf[2],
                                        local_90.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceName");
    aliyun::BatchCompute::PutJob
              ((BatchComputePutJobRequestType *)this,(BatchComputePutJobResponseType *)&local_f0,
               &local_f1);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_13();
LAB_0010633e:
    local_50.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_50.field_2._M_local_buf[2] = '7';
    local_50.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_50.field_2._M_local_buf[7] = '.';
    local_50.field_2._8_7_ = 0x34333232313a31;
    local_50._M_string_length = 0xf;
    local_50.field_2._M_local_buf[0xf] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    aliyun::BatchCompute::SetProxyHost(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT17(local_50.field_2._M_local_buf[7],
                               CONCAT43(local_50.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_50.field_2._M_local_buf[2],
                                                 local_50.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    if (this[0x28] == (BatchCompute)0x1) {
      this[0x29] = (BatchCompute)0x0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_90.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_90._M_string_length = 2;
    local_90.field_2._M_local_buf[2] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_90.field_2._M_local_buf[2],
                                        local_90.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)&local_f0,"ResourceName");
    aliyun::BatchCompute::ReleaseJob
              ((BatchComputeReleaseJobRequestType *)this,
               (BatchComputeReleaseJobResponseType *)&local_f0,&local_f1);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_14();
  }
  local_50.field_2._M_allocated_capacity._0_2_ = 0x3231;
  local_50.field_2._M_local_buf[2] = '7';
  local_50.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
  local_50.field_2._M_local_buf[7] = '.';
  local_50.field_2._8_7_ = 0x34333232313a31;
  local_50._M_string_length = 0xf;
  local_50.field_2._M_local_buf[0xf] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  aliyun::BatchCompute::SetProxyHost(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT17(local_50.field_2._M_local_buf[7],
                             CONCAT43(local_50.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_50.field_2._M_local_buf[2],
                                               local_50.field_2._M_allocated_capacity._0_2_))) + 1);
  }
  if (this[0x28] == (BatchCompute)0x1) {
    this[0x29] = (BatchCompute)0x0;
  }
  pHVar2 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar2,0x2fca);
  local_90.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_90._M_string_length = 2;
  local_90.field_2._M_local_buf[2] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  HttpTestListener::SetResponseBody(pHVar2,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_90.field_2._M_local_buf[2],
                                      local_90.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  HttpTestListener::Start(pHVar2);
  std::__cxx11::string::operator=((string *)&local_f0,"ResourceName");
  aliyun::BatchCompute::StartJob
            ((BatchComputeStartJobRequestType *)this,(BatchComputeStartJobResponseType *)&local_f0,
             &local_f1);
  HttpTestListener::WaitComplete(pHVar2);
  main_cold_15();
LAB_00106544:
  local_50.field_2._M_allocated_capacity._0_2_ = 0x3231;
  local_50.field_2._M_local_buf[2] = '7';
  local_50.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
  local_50.field_2._M_local_buf[7] = '.';
  local_50.field_2._8_7_ = 0x34333232313a31;
  local_50._M_string_length = 0xf;
  local_50.field_2._M_local_buf[0xf] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  aliyun::BatchCompute::SetProxyHost(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT17(local_50.field_2._M_local_buf[7],
                             CONCAT43(local_50.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_50.field_2._M_local_buf[2],
                                               local_50.field_2._M_allocated_capacity._0_2_))) + 1);
  }
  if (this[0x28] == (BatchCompute)0x1) {
    this[0x29] = (BatchCompute)0x0;
  }
  pHVar2 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar2,0x2fca);
  local_90.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_90._M_string_length = 2;
  local_90.field_2._M_local_buf[2] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  HttpTestListener::SetResponseBody(pHVar2,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_90.field_2._M_local_buf[2],
                                      local_90.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  HttpTestListener::Start(pHVar2);
  std::__cxx11::string::operator=((string *)&local_f0,"ResourceName");
  aliyun::BatchCompute::StopJob
            ((BatchComputeStopJobRequestType *)this,(BatchComputeStopJobResponseType *)&local_f0,
             &local_f1);
  HttpTestListener::WaitComplete(pHVar2);
  main_cold_16();
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT17((undefined1)uStack_d9,CONCAT61(uStack_df,local_e0)) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_delete_image();
  test_delete_job();
  test_delete_snapshot();
  test_get_image();
  test_get_job();
  test_get_job_description();
  test_get_snapshot();
  test_get_tasks();
  test_list_images();
  test_list_jobs();
  test_list_snapshots();
  test_post_job();
  test_put_job();
  test_release_job();
  test_start_job();
  test_stop_job();
}